

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  ImDrawList *this;
  ImGuiWindow *pIVar1;
  ImDrawVert *pIVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  ImDrawCmd *pIVar12;
  long lVar13;
  ImDrawCmd *pIVar14;
  ulong uVar15;
  unsigned_short *puVar16;
  int iVar17;
  int local_1e4;
  ImGuiListClipper clipper;
  ImVec2 local_190;
  ImVec2 triangles_pos [3];
  char buf [300];
  undefined1 local_3c [12];
  
  pcVar10 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar10 = draw_list->_OwnerName;
  }
  iVar17 = (draw_list->CmdBuffer).Size;
  bVar5 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar10,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar17);
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->DrawList == draw_list) {
    SameLine(0.0,-1.0);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = -0x80;
    buf[3] = '?';
    buf[4] = -0x36;
    buf[5] = -0x38;
    buf[6] = -0x38;
    buf[7] = '>';
    buf[8] = -0x36;
    buf[9] = -0x38;
    buf[10] = -0x38;
    buf[0xb] = '>';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = -0x80;
    buf[0xf] = '?';
    TextColored((ImVec4 *)buf,"CURRENTLY APPENDING");
    if (!bVar5) {
      return;
    }
  }
  else {
    this = &pIVar3->OverlayDrawList;
    if ((window != (ImGuiWindow *)0x0) && (bVar6 = IsItemHovered(0), bVar6)) {
      buf._0_4_ = (window->Size).x + (window->Pos).x;
      buf._4_4_ = (window->Size).y + (window->Pos).y;
      ImDrawList::AddRect(this,&window->Pos,(ImVec2 *)buf,0xff00ffff,0.0,0xf,1.0);
    }
    if (!bVar5) {
      return;
    }
    pIVar12 = (draw_list->CmdBuffer).Data;
    local_1e4 = 0;
    for (pIVar14 = pIVar12; pIVar14 < pIVar12 + (draw_list->CmdBuffer).Size; pIVar14 = pIVar14 + 1)
    {
      if (pIVar14->UserCallback == (ImDrawCallback)0x0) {
        uVar7 = pIVar14->ElemCount;
        if (uVar7 != 0) {
          if ((draw_list->IdxBuffer).Size < 1) {
            pcVar10 = "non-indexed";
            puVar16 = (unsigned_short *)0x0;
          }
          else {
            puVar16 = (draw_list->IdxBuffer).Data;
            pcVar10 = "indexed";
          }
          bVar5 = TreeNode((void *)(((long)pIVar14 - (long)pIVar12) / 0x30),
                           "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                           SUB84((double)(pIVar14->ClipRect).x,0),(double)(pIVar14->ClipRect).y,
                           (double)(pIVar14->ClipRect).z,(double)(pIVar14->ClipRect).w,(ulong)uVar7,
                           pcVar10,pIVar14->TextureId,(ulong)uVar7,iVar17);
          if ((show_draw_cmd_clip_rects == true) && (bVar6 = IsItemHovered(0), bVar6)) {
            buf._0_8_ = *(undefined8 *)&pIVar14->ClipRect;
            buf._8_8_ = *(undefined8 *)&(pIVar14->ClipRect).z;
            clipper.StartPosY = 3.4028235e+38;
            clipper.ItemsHeight = 3.4028235e+38;
            clipper.ItemsCount = -0x800001;
            clipper.StepNo = -0x800001;
            for (lVar13 = (long)local_1e4; lVar13 < (long)(int)pIVar14->ElemCount + (long)local_1e4;
                lVar13 = lVar13 + 1) {
              uVar7 = (uint)lVar13;
              if (puVar16 != (unsigned_short *)0x0) {
                uVar7 = (uint)puVar16[lVar13];
              }
              ImRect::Add((ImRect *)&clipper,&(draw_list->VtxBuffer).Data[(int)uVar7].pos);
            }
            ImRect::Floor((ImRect *)buf);
            ImDrawList::AddRect(this,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff00ffff,0.0,0xf,1.0);
            ImRect::Floor((ImRect *)&clipper);
            ImDrawList::AddRect(this,(ImVec2 *)&clipper,(ImVec2 *)&clipper.ItemsCount,0xffff00ff,0.0
                                ,0xf,1.0);
          }
          if (bVar5) {
            uVar7 = pIVar14->ElemCount;
            clipper.StartPosY = GetCursorPosY();
            clipper.ItemsHeight = -1.0;
            clipper.StepNo = 0;
            clipper.DisplayStart = -1;
            clipper.DisplayEnd = -1;
            clipper.ItemsCount = uVar7 / 3;
            while (bVar5 = ImGuiListClipper::Step(&clipper), iVar4 = clipper.DisplayEnd, bVar5) {
              uVar15 = (ulong)(uint)(clipper.DisplayStart * 3 + local_1e4);
              for (iVar9 = clipper.DisplayStart; iVar9 < iVar4; iVar9 = iVar9 + 1) {
                triangles_pos[0].x = 0.0;
                triangles_pos[0].y = 0.0;
                triangles_pos[1].x = 0.0;
                triangles_pos[1].y = 0.0;
                triangles_pos[2].x = 0.0;
                triangles_pos[2].y = 0.0;
                pcVar10 = buf;
                for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
                  if (puVar16 == (unsigned_short *)0x0) {
                    uVar7 = (int)uVar15 + (int)lVar13;
                  }
                  else {
                    uVar7 = (uint)puVar16[(int)uVar15 + lVar13];
                  }
                  pIVar2 = (draw_list->VtxBuffer).Data;
                  triangles_pos[lVar13] = pIVar2[(int)uVar7].pos;
                  pcVar11 = "   ";
                  if (lVar13 == 0) {
                    pcVar11 = "vtx";
                  }
                  iVar8 = ImFormatString(pcVar10,(long)((int)local_3c - (int)pcVar10),
                                         "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                         SUB84((double)pIVar2[(int)uVar7].pos.x,0),
                                         (double)pIVar2[(int)uVar7].pos.y,
                                         (double)pIVar2[(int)uVar7].uv.x,
                                         (double)pIVar2[(int)uVar7].uv.y,pcVar11,
                                         (uVar15 & 0xffffffff) + lVar13,
                                         (ulong)pIVar2[(int)uVar7].col);
                  pcVar10 = pcVar10 + iVar8;
                }
                local_190.x = 0.0;
                local_190.y = 0.0;
                Selectable(buf,false,0,&local_190);
                bVar5 = IsItemHovered(0);
                if (bVar5) {
                  uVar7 = (pIVar3->OverlayDrawList).Flags;
                  (pIVar3->OverlayDrawList).Flags = uVar7 & 0xfffffffe;
                  ImDrawList::AddPolyline(this,triangles_pos,3,0xff00ffff,true,1.0);
                  (pIVar3->OverlayDrawList).Flags = uVar7;
                }
                uVar15 = (uVar15 & 0xffffffff) + 3;
              }
            }
            TreePop();
          }
        }
      }
      else {
        BulletText("Callback %p, user_data %p",pIVar14->UserCallback,pIVar14->UserCallbackData);
      }
      local_1e4 = local_1e4 + pIVar14->ElemCount;
      pIVar12 = (draw_list->CmdBuffer).Data;
    }
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* overlay_draw_list = GetOverlayDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                overlay_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                if (show_draw_cmd_clip_rects && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                    vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char buf[300];
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, vtx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, (int)(buf_end - buf_p), "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = overlay_draw_list->Flags;
                            overlay_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            overlay_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }